

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_formatting.cpp
# Opt level: O3

void test_by_char<char,wchar_t>(locale *l,locale *lreal)

{
  uint *puVar1;
  long lVar2;
  _Alloc_hider _Var3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  money_put *pmVar7;
  money_get *pmVar8;
  string *psVar9;
  tm *ptVar10;
  time_put *ptVar11;
  runtime_error *prVar12;
  bool bVar13;
  iostate err;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> rfmt;
  time_t a_datetime;
  double n;
  ss_ref_type ss_ref;
  ss_type ss;
  string local_458;
  undefined8 local_438;
  long lStack_430;
  char *local_428;
  locale *local_418;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_410;
  time_t local_3f0;
  locale *local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  locale local_3c0 [8];
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  byte abStack_398 [8];
  uint auStack_390 [22];
  ios_base aiStack_338 [120];
  long alStack_2c0 [18];
  locale local_230 [8];
  locale local_228 [8];
  locale local_220 [8];
  locale local_218 [8];
  locale local_210 [8];
  locale local_208 [8];
  locale local_200 [8];
  locale local_1f8 [8];
  locale local_1f0 [12];
  longdouble local_1e4;
  double local_1d8 [2];
  long local_1c8 [2];
  byte abStack_1b8 [8];
  uint auStack_1b0 [22];
  ios_base local_158 [104];
  long alStack_f0 [20];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  local_418 = lreal;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Testing as::posix",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  local_3e8 = l;
  std::ios::imbue(local_1f0);
  std::locale::~locale(local_1f0);
  std::ostream::_M_insert<double>(1045.45);
  test_counter = test_counter + 1;
  if ((abStack_1b8[*(long *)((long)local_1d8[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ss",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_3b8._0_8_ = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,(string *)local_3b8);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::istream::_M_extract<double>(local_1d8);
  test_counter = test_counter + 1;
  if ((abStack_1b8[*(long *)((long)local_1d8[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x4b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ss",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_3b8._0_8_ = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,(string *)local_3b8);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (((double)local_3e0._M_dataplus._M_p != 1045.45) || (NAN((double)local_3e0._M_dataplus._M_p)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x4c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," n == 1045.45",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_3b8._0_8_ = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,(string *)local_3b8);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"1045.45","");
  std::locale::locale(local_3c0,local_3e8);
  booster::locale::conv::from_utf<char>
            (&local_458,(char *)local_410._M_dataplus._M_p,
             (char *)(local_410._M_string_length + (long)local_410._M_dataplus._M_p),local_3c0,
             default_method);
  _Var3._M_p = local_458._M_dataplus._M_p;
  if (local_3b8._8_8_ == local_458._M_string_length) {
    if (local_3b8._8_8_ == 0) {
      bVar13 = true;
    }
    else {
      iVar4 = bcmp((void *)local_3b8._0_8_,local_458._M_dataplus._M_p,local_3b8._8_8_);
      bVar13 = iVar4 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != &local_458.field_2) {
    operator_delete(_Var3._M_p);
  }
  std::locale::~locale(local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._0_8_ != &local_3a8) {
    operator_delete((void *)local_3b8._0_8_);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x4d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," ss.str()==to_correct_string<CharType>(\"1045.45\",l)",0x33);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_3b8._0_8_ = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,(string *)local_3b8);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
  std::ios_base::~ios_base(local_158);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Testing as::number",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  std::ios::imbue(local_1f8);
  std::locale::~locale(local_1f8);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(*(long *)(local_1c8[0] + -0x18) + (long)local_1c8));
  booster::locale::ios_info::display_flags(uVar6);
  std::ostream::_M_insert<double>(1045.45);
  test_counter = test_counter + 1;
  if ((abStack_1b8[*(long *)((long)local_1d8[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ss",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_3b8._0_8_ = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,(string *)local_3b8);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::istream::_M_extract<double>(local_1d8);
  test_counter = test_counter + 1;
  if ((abStack_1b8[*(long *)((long)local_1d8[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ss",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_3b8._0_8_ = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,(string *)local_3b8);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (((double)local_3e0._M_dataplus._M_p != 1045.45) || (NAN((double)local_3e0._M_dataplus._M_p)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," n == 1045.45",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_3b8._0_8_ = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,(string *)local_3b8);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstringstream::wstringstream((wstringstream *)local_3b8);
  std::wios::imbue(local_200);
  std::locale::~locale(local_200);
  std::wostream::_M_insert<double>(1045.45);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::wstringbuf::str();
  bVar13 = equal<char,wchar_t>(&local_458,&local_410);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x65);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," equal(ss.str(),ss_ref.str())",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_458,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,&local_458);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_3b8);
  std::ios_base::~ios_base(aiStack_338);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
  std::ios_base::~ios_base(local_158);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Testing as::currency national ",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__cxx11::wstringstream::wstringstream((wstringstream *)local_1d8);
  std::wios::imbue(local_208);
  std::locale::~locale(local_208);
  puVar1 = (uint *)((long)auStack_1b0 + *(long *)(local_1c8[0] + -0x18));
  *puVar1 = *puVar1 | 0x200;
  pmVar7 = std::
           use_facet<std::__cxx11::money_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (local_418);
  lVar2 = *(long *)((long)alStack_f0 + *(long *)(local_1c8[0] + -0x18) + 0x10);
  local_1e4 = (longdouble)104334.0;
  (**(code **)(*(long *)pmVar7 + 0x10))
            (pmVar7,lVar2,lVar2 == 0,0,
             (stringstream *)local_1d8 + *(long *)((long)local_1d8[0] + -0x18),0x20,
             SUB108(local_1e4,0),(short)((unkuint10)local_1e4 >> 0x40));
  local_458._M_dataplus._M_p = (pointer)((ulong)local_458._M_dataplus._M_p._4_4_ << 0x20);
  pmVar8 = std::
           use_facet<std::__cxx11::money_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (local_418);
  (**(code **)(*(long *)pmVar8 + 0x10))
            (pmVar8,*(undefined8 *)((long)alStack_f0 + *(long *)((long)local_1d8[0] + -0x18)),
             0xffffffff,0,0xffffffff,0,(long)local_1d8 + *(long *)((long)local_1d8[0] + -0x18),
             (short)&local_458,(wstringstream *)local_3b8);
  _Var3._M_p = local_458._M_dataplus._M_p;
  if (((ulong)local_458._M_dataplus._M_p & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-- Looks like standard library does not support parsing well",
               0x3c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_3b8);
  std::ios::imbue(local_210);
  std::locale::~locale(local_210);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)
                     ((long)&local_3a8 +
                     *(long *)(CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                        local_3a8._M_local_buf[0]) + -0x18)));
  booster::locale::ios_info::display_flags(uVar6);
  std::ostream::_M_insert<double>(1043.34);
  if (((ulong)_Var3._M_p & 4) == 0) {
    test_counter = test_counter + 1;
    if ((abStack_398[*(long *)(local_3b8._0_8_ + -0x18)] & 5) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x85);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ss",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar4 = error_counter + 1;
      bVar13 = 0x14 < error_counter;
      error_counter = iVar4;
      if (bVar13) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_458,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar12,&local_458);
        __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                   );
      }
    }
    std::istream::_M_extract<double>((double *)local_3b8);
  }
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::wstringbuf::str();
  bVar13 = equal<char,wchar_t>(&local_458,&local_410);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x8b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," equal(ss.str(),ss_ref.str())",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_458,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,&local_458);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3b8);
  std::ios_base::~ios_base(aiStack_338);
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_1d8);
  std::ios_base::~ios_base(local_158);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Testing as::currency iso",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  std::ios::imbue(local_218);
  std::locale::~locale(local_218);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(*(long *)(local_1c8[0] + -0x18) + (long)local_1c8));
  booster::locale::ios_info::display_flags(uVar6);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(*(long *)(local_1c8[0] + -0x18) + (long)local_1c8));
  booster::locale::ios_info::currency_flags(uVar6);
  std::ostream::_M_insert<double>(1043.34);
  test_counter = test_counter + 1;
  if ((abStack_1b8[*(long *)((long)local_1d8[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ss",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_3b8._0_8_ = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,(string *)local_3b8);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::istream::_M_extract<double>(local_1d8);
  test_counter = test_counter + 1;
  if ((abStack_1b8[*(long *)((long)local_1d8[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ss",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_3b8._0_8_ = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,(string *)local_3b8);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (((double)local_3e0._M_dataplus._M_p != 1043.34) || (NAN((double)local_3e0._M_dataplus._M_p)))
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v1==1043.34",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_3b8._0_8_ = &local_3a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,(string *)local_3b8);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstringstream::wstringstream((wstringstream *)local_3b8);
  std::wios::imbue(local_220);
  std::locale::~locale(local_220);
  puVar1 = (uint *)((long)auStack_390 +
                   *(long *)(CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                      local_3a8._M_local_buf[0]) + -0x18));
  *puVar1 = *puVar1 | 0x200;
  pmVar7 = std::
           use_facet<std::__cxx11::money_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (local_418);
  lVar2 = *(long *)((long)alStack_2c0 +
                   *(long *)(CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                      local_3a8._M_local_buf[0]) + -0x18));
  (**(code **)(*(long *)pmVar7 + 0x10))
            (pmVar7,lVar2,lVar2 == 0,1,
             (wstringstream *)local_3b8 + *(long *)(local_3b8._0_8_ + -0x18),0x20,
             SUB108(local_1e4,0),(short)((unkuint10)local_1e4 >> 0x40));
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::wstringbuf::str();
  bVar13 = equal<char,wchar_t>(&local_458,&local_410);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," equal(ss.str(),ss_ref.str())",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_458,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,&local_458);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_3b8);
  std::ios_base::~ios_base(aiStack_338);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
  std::ios_base::~ios_base(local_158);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Testing as::date/time",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  std::ios::imbue(local_228);
  std::locale::~locale(local_228);
  local_3f0 = 0x2eff39;
  local_3b8._8_8_ = 0;
  local_3a8._M_local_buf[0] = '\0';
  local_3b8._0_8_ = &local_3a8;
  std::__cxx11::string::_M_replace((ulong)local_3b8,0,(char *)0x0,0x10e431);
  psVar9 = (string *)
           booster::locale::ios_info::get
                     ((ios_base *)(*(long *)(local_1c8[0] + -0x18) + (long)local_1c8));
  booster::locale::ios_info::time_zone(psVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._0_8_ != &local_3a8) {
    operator_delete((void *)local_3b8._0_8_);
  }
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(*(long *)(local_1c8[0] + -0x18) + (long)local_1c8));
  booster::locale::ios_info::display_flags(uVar6);
  poVar5 = std::ostream::_M_insert<long>((long)local_1c8);
  local_3b8[0] = (wstringstream)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3b8,1);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(*(long *)(local_1c8[0] + -0x18) + (long)local_1c8));
  booster::locale::ios_info::display_flags(uVar6);
  poVar5 = std::ostream::_M_insert<long>((long)local_1c8);
  local_3b8[0] = (wstringstream)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3b8,1);
  uVar6 = booster::locale::ios_info::get
                    ((ios_base *)(*(long *)(local_1c8[0] + -0x18) + (long)local_1c8));
  booster::locale::ios_info::display_flags(uVar6);
  poVar5 = std::ostream::_M_insert<long>((long)local_1c8);
  local_3b8[0] = (wstringstream)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3b8,1);
  local_3b8._8_8_ = 0;
  local_3a8._M_local_buf[0] = '\0';
  local_3b8._0_8_ = &local_3a8;
  std::__cxx11::string::_M_replace((ulong)local_3b8,0,(char *)0x0,0x10e435);
  psVar9 = (string *)
           booster::locale::ios_info::get
                     ((ios_base *)(*(long *)(local_1c8[0] + -0x18) + (long)local_1c8));
  booster::locale::ios_info::time_zone(psVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._0_8_ != &local_3a8) {
    operator_delete((void *)local_3b8._0_8_);
  }
  conv_to_char<char>(&local_458,"%H");
  booster::locale::as::ftime<char>((add_ftime<char> *)local_3b8,&local_458);
  booster::locale::as::details::add_ftime<char>::apply
            ((add_ftime<char> *)local_3b8,
             (basic_ios<char,_std::char_traits<char>_> *)
             (*(long *)(local_1c8[0] + -0x18) + (long)local_1c8));
  poVar5 = std::ostream::_M_insert<long>((long)local_1c8);
  local_410._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_410,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._0_8_ != &local_3a8) {
    operator_delete((void *)local_3b8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  local_3b8._8_8_ = 0;
  local_3a8._M_local_buf[0] = '\0';
  local_3b8._0_8_ = &local_3a8;
  std::__cxx11::string::_M_replace((ulong)local_3b8,0,(char *)0x0,0x10e442);
  psVar9 = (string *)
           booster::locale::ios_info::get
                     ((ios_base *)(*(long *)(local_1c8[0] + -0x18) + (long)local_1c8));
  booster::locale::ios_info::time_zone(psVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._0_8_ != &local_3a8) {
    operator_delete((void *)local_3b8._0_8_);
  }
  conv_to_char<char>(&local_458,"%M");
  booster::locale::as::ftime<char>((add_ftime<char> *)local_3b8,&local_458);
  booster::locale::as::details::add_ftime<char>::apply
            ((add_ftime<char> *)local_3b8,
             (basic_ios<char,_std::char_traits<char>_> *)
             (*(long *)(local_1c8[0] + -0x18) + (long)local_1c8));
  poVar5 = std::ostream::_M_insert<long>((long)local_1c8);
  local_410._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_410,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._0_8_ != &local_3a8) {
    operator_delete((void *)local_3b8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  std::__cxx11::wstringstream::wstringstream((wstringstream *)local_3b8);
  std::wios::imbue(local_230);
  std::locale::~locale(local_230);
  conv_to_char<wchar_t>(&local_410,"%x\n%X\n%c\n16\n48\n");
  ptVar10 = gmtime(&local_3f0);
  local_458._M_dataplus._M_p = *(pointer *)ptVar10;
  local_458._M_string_length._0_4_ = ptVar10->tm_hour;
  local_458._M_string_length._4_4_ = ptVar10->tm_mday;
  local_458.field_2._0_4_ = ptVar10->tm_mon;
  local_458.field_2._4_4_ = ptVar10->tm_year;
  local_458.field_2._8_4_ = ptVar10->tm_wday;
  local_458.field_2._12_4_ = ptVar10->tm_yday;
  local_438 = *(undefined8 *)&ptVar10->tm_isdst;
  lStack_430 = ptVar10->tm_gmtoff;
  local_428 = ptVar10->tm_zone;
  ptVar11 = std::
            use_facet<std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                      (local_418);
  lVar2 = *(long *)((long)alStack_2c0 +
                   *(long *)(CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                      local_3a8._M_local_buf[0]) + -0x18));
  std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::put
            (ptVar11,lVar2,lVar2 == 0,
             (wstringstream *)local_3b8 + *(long *)(local_3b8._0_8_ + -0x18),0x20,&local_458,
             local_410._M_dataplus._M_p,
             (short)local_410._M_dataplus._M_p + (short)local_410._M_string_length * 4);
  test_counter = test_counter + 1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::wstringbuf::str();
  bVar13 = equal<char,wchar_t>(&local_3e0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xca);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," equal(ss.str(),ss_ref.str())",0x1d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar13 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar13) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar12,&local_3e0);
      __cxa_throw(prVar12,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_3b8);
  std::ios_base::~ios_base(aiStack_338);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
  std::ios_base::~ios_base(local_158);
  return;
}

Assistant:

void test_by_char(std::locale const &l,std::locale const &lreal)
{
    typedef std::basic_stringstream<CharType> ss_type;
    typedef std::basic_stringstream<RefCharType> ss_ref_type;

    using namespace booster::locale;

    {
        std::cout << "- Testing as::posix" << std::endl;
        ss_type ss;
        ss.imbue(l);

        ss << 1045.45;
        TEST(ss);
        double n;
        ss >> n;
        TEST(ss);
        TEST(n == 1045.45);
        TEST(ss.str()==to_correct_string<CharType>("1045.45",l));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        #endif
    }

    {
        std::cout << "- Testing as::number" << std::endl;
        ss_type ss;
        ss.imbue(l);

        ss << as::number;
        ss << 1045.45;
        TEST(ss);
        double n;
        ss >> n;
        TEST(ss);
        TEST(n == 1045.45);

        ss_ref_type ss_ref;
        ss_ref.imbue(lreal);

        ss_ref << 1045.45;

        TEST(equal(ss.str(),ss_ref.str()));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        std::cout << "[" << booster::locale::conv::from_utf(ss_ref.str(),"UTF-8") << "]\n" ;
        #endif
    }

    {
        std::cout << "- Testing as::currency national " << std::endl;

        bool bad_parsing = false;
        ss_ref_type ss_ref;
        ss_ref.imbue(lreal);
        ss_ref << std::showbase;
        std::use_facet<std::money_put<RefCharType> >(lreal).put(ss_ref,false,ss_ref,RefCharType(' '),104334);
        { // workaround MSVC library issues
            std::ios_base::iostate err=std::ios_base::iostate();
            typename std::money_get<RefCharType>::iter_type end;
            long double tmp;
            std::use_facet<std::money_get<RefCharType> >(lreal).get(ss_ref,end,false,ss_ref,err,tmp);
            if(err & std::ios_base::failbit) {
                std::cout << "-- Looks like standard library does not support parsing well" << std::endl;
                bad_parsing=true;
            }
        }

        ss_type ss;
        ss.imbue(l);

        ss << as::currency;
        ss << 1043.34;
        if(!bad_parsing) {
            TEST(ss);
            double v1;
            ss >> v1;
        }


        TEST(equal(ss.str(),ss_ref.str()));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        std::cout << "[" << booster::locale::conv::from_utf(ss_ref.str(),"UTF-8") << "]\n" ;
        #endif

    }

    {
        std::cout << "- Testing as::currency iso" << std::endl;
        ss_type ss;
        ss.imbue(l);

        ss << as::currency << as::currency_iso;
        ss << 1043.34;
        TEST(ss);
        double v1;
        ss >> v1;
        TEST(ss);
        TEST(v1==1043.34);

        ss_ref_type ss_ref;
        ss_ref.imbue(lreal);
        ss_ref << std::showbase;
        std::use_facet<std::money_put<RefCharType> >(lreal).put(ss_ref,true,ss_ref,RefCharType(' '),104334);

        TEST(equal(ss.str(),ss_ref.str()));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        std::cout << "[" << booster::locale::conv::from_utf(ss_ref.str(),"UTF-8") << "]\n" ;
        #endif
    }
    
    
    {
        std::cout << "- Testing as::date/time" << std::endl;
        ss_type ss;
        ss.imbue(l);
        
        time_t a_date = 3600*24*(31+4); // Feb 5th
        time_t a_time = 3600*15+60*33; // 15:33:05
        time_t a_timesec = 13;
        time_t a_datetime = a_date + a_time + a_timesec;

        ss << as::time_zone("GMT");

        ss << as::date << a_datetime << CharType('\n');
        ss << as::time << a_datetime << CharType('\n');
        ss << as::datetime << a_datetime << CharType('\n');
        ss << as::time_zone("GMT+01:00");
        ss << as::ftime(conv_to_char<CharType>("%H")) << a_datetime << CharType('\n');
        ss << as::time_zone("GMT+00:15");
        ss << as::ftime(conv_to_char<CharType>("%M")) << a_datetime << CharType('\n');

        ss_ref_type ss_ref;
        ss_ref.imbue(lreal);

        std::basic_string<RefCharType> rfmt(conv_to_char<RefCharType>("%x\n%X\n%c\n16\n48\n"));

        std::tm tm=*gmtime(&a_datetime);

        std::use_facet<std::time_put<RefCharType> >(lreal).put(ss_ref,ss_ref,RefCharType(' '),&tm,rfmt.c_str(),rfmt.c_str()+rfmt.size());

        TEST(equal(ss.str(),ss_ref.str()));
        #ifdef DEBUG_FMT
        std::cout << "[" << booster::locale::conv::from_utf(ss.str(),"UTF-8") << "]=\n" ;
        std::cout << "[" << booster::locale::conv::from_utf(ss_ref.str(),"UTF-8") << "]\n" ;
        #endif
    }

}